

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda_expression.cpp
# Opt level: O3

vector<std::reference_wrapper<duckdb::ParsedExpression>,_true> * __thiscall
duckdb::LambdaExpression::ExtractColumnRefExpressions
          (vector<std::reference_wrapper<duckdb::ParsedExpression>,_true> *__return_storage_ptr__,
          LambdaExpression *this,string *error_message)

{
  iterator iVar1;
  pointer puVar2;
  long lVar3;
  int iVar4;
  pointer pPVar5;
  type pPVar6;
  BaseExpression *this_00;
  FunctionExpression *pFVar7;
  long *__dest;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *this_01
  ;
  pointer this_02;
  size_type __dnew;
  long local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
  ).
  super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_01 = &this->lhs;
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(this_01);
  if ((pPVar5->super_BaseExpression).expression_class == COLUMN_REF) {
    pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(this_01);
    iVar1._M_current =
         (__return_storage_ptr__->
         super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
         ).
         super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar1._M_current !=
        (__return_storage_ptr__->
        super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
        ).
        super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      (iVar1._M_current)->_M_data = pPVar6;
      (__return_storage_ptr__->
      super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      return __return_storage_ptr__;
    }
    ::std::
    vector<std::reference_wrapper<duckdb::ParsedExpression>,std::allocator<std::reference_wrapper<duckdb::ParsedExpression>>>
    ::_M_realloc_insert<duckdb::ParsedExpression&>
              ((vector<std::reference_wrapper<duckdb::ParsedExpression>,std::allocator<std::reference_wrapper<duckdb::ParsedExpression>>>
                *)__return_storage_ptr__,iVar1,pPVar6);
    return __return_storage_ptr__;
  }
  pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(this_01);
  if ((pPVar5->super_BaseExpression).expression_class == FUNCTION) {
    this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_01)->super_BaseExpression;
    pFVar7 = BaseExpression::Cast<duckdb::FunctionExpression>(this_00);
    iVar4 = ::std::__cxx11::string::compare((char *)&pFVar7->function_name);
    if (iVar4 != 0) {
      local_50 = local_40;
      local_58 = 0x61;
      __dest = (long *)::std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_58);
      goto LAB_00e33c16;
    }
    puVar2 = (pFVar7->children).
             super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (this_02 = (pFVar7->children).
                   super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_02 != puVar2;
        this_02 = this_02 + 1) {
      pPVar5 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(this_02);
      if ((pPVar5->super_BaseExpression).expression_class != COLUMN_REF) {
        local_50 = local_40;
        local_58 = 0x61;
        __dest = (long *)::std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_58);
        goto LAB_00e33c16;
      }
      pPVar6 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator*(this_02);
      iVar1._M_current =
           (__return_storage_ptr__->
           super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
           ).
           super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar1._M_current ==
          (__return_storage_ptr__->
          super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
          ).
          super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        ::std::
        vector<std::reference_wrapper<duckdb::ParsedExpression>,std::allocator<std::reference_wrapper<duckdb::ParsedExpression>>>
        ::_M_realloc_insert<duckdb::ParsedExpression&>
                  ((vector<std::reference_wrapper<duckdb::ParsedExpression>,std::allocator<std::reference_wrapper<duckdb::ParsedExpression>>>
                    *)__return_storage_ptr__,iVar1,pPVar6);
      }
      else {
        (iVar1._M_current)->_M_data = pPVar6;
        (__return_storage_ptr__->
        super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
        ).
        super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = iVar1._M_current + 1;
      }
    }
  }
  if ((__return_storage_ptr__->
      super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (__return_storage_ptr__->
      super_vector<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ).
      super__Vector_base<std::reference_wrapper<duckdb::ParsedExpression>,_std::allocator<std::reference_wrapper<duckdb::ParsedExpression>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return __return_storage_ptr__;
  }
  local_50 = local_40;
  local_58 = 0x61;
  __dest = (long *)::std::__cxx11::string::_M_create((ulong *)&local_50,(ulong)&local_58);
LAB_00e33c16:
  lVar3 = local_58;
  local_40[0] = local_58;
  local_50 = __dest;
  switchD_012b9b0d::default
            (__dest,
             "Invalid lambda parameters! Parameters must be unqualified comma-separated names like x or (x, y)."
             ,0x61);
  local_48 = lVar3;
  *(undefined1 *)((long)__dest + lVar3) = 0;
  ::std::__cxx11::string::operator=((string *)error_message,(string *)&local_50);
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<reference<ParsedExpression>> LambdaExpression::ExtractColumnRefExpressions(string &error_message) {

	// we return an error message because we can't throw a binder exception here,
	// since we can't distinguish between a lambda function and the JSON operator yet
	vector<reference<ParsedExpression>> column_refs;

	if (lhs->GetExpressionClass() == ExpressionClass::COLUMN_REF) {
		// single column reference
		column_refs.emplace_back(*lhs);
		return column_refs;
	}

	if (lhs->GetExpressionClass() == ExpressionClass::FUNCTION) {
		// list of column references
		auto &func_expr = lhs->Cast<FunctionExpression>();
		if (func_expr.function_name != "row") {
			error_message = InvalidParametersErrorMessage();
			return column_refs;
		}

		for (auto &child : func_expr.children) {
			if (child->GetExpressionClass() != ExpressionClass::COLUMN_REF) {
				error_message = InvalidParametersErrorMessage();
				return column_refs;
			}
			column_refs.emplace_back(*child);
		}
	}

	if (column_refs.empty()) {
		error_message = InvalidParametersErrorMessage();
	}
	return column_refs;
}